

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

NodeScalar * __thiscall c4::yml::Tree::valsc(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar2;
  error_flags eVar3;
  NodeScalar *pNVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeScalar *)(*pcVar1)();
        return pNVar4;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((this->m_buf[node].m_type.type & VAL) == NOTYPE) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeScalar *)(*pcVar1)();
        return pNVar4;
      }
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4bc8) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x4bc8) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: has_val(node)",0x1b,loc_00);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pNVar4 = (NodeScalar *)(*pcVar1)();
        return pNVar4;
      }
    }
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  return &this->m_buf[node].m_val;
}

Assistant:

NodeScalar const& valsc     (size_t node) const { RYML_ASSERT(has_val(node)); return _p(node)->m_val; }